

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall spv::Instruction::setIdOperand(Instruction *this,uint idx,Id id)

{
  if (id == 0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0x71,"void spv::Instruction::setIdOperand(unsigned int, Id)");
  }
  if (((this->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_start.super__Bit_iterator_base._M_p[idx >> 6] >> ((ulong)idx & 0x3f) & 1) != 0) {
    (this->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[idx] = id;
    return;
  }
  __assert_fail("idOperand[idx]",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0x72,"void spv::Instruction::setIdOperand(unsigned int, Id)");
}

Assistant:

void setIdOperand(unsigned idx, Id id) {
        assert(id);
        assert(idOperand[idx]);
        operands[idx] = id;
    }